

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O1

void get_msurf_descriptor_haar_unroll_6_3_True(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [32];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float *data;
  int iVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  ulong uVar26;
  int c1;
  int iVar27;
  int iVar28;
  ulong uVar29;
  int c2;
  int iVar30;
  long lVar31;
  int iVar32;
  ulong uVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  uint uVar45;
  int iVar46;
  int iVar47;
  long lVar48;
  int c1_8;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  float *pfVar54;
  float *pfVar55;
  long lVar56;
  long lVar57;
  int iVar58;
  int iVar59;
  float *pfVar60;
  long lVar61;
  int c2_4;
  long lVar62;
  long lVar63;
  long lVar64;
  int iVar65;
  ulong uVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar87;
  float fVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  float fVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar105;
  undefined1 auVar107 [12];
  undefined1 auVar106 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [64];
  int data_width;
  
  auVar74._8_4_ = 0x80000000;
  auVar74._0_8_ = 0x8000000080000000;
  auVar74._12_4_ = 0x80000000;
  auVar75._8_4_ = 0x3effffff;
  auVar75._0_8_ = 0x3effffff3effffff;
  auVar75._12_4_ = 0x3effffff;
  auVar106 = ZEXT1664(auVar75);
  fVar82 = ipoint->scale;
  auVar110 = ZEXT464((uint)fVar82);
  auVar67 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)fVar82),auVar74,0xf8);
  auVar67 = ZEXT416((uint)(fVar82 + auVar67._0_4_));
  auVar67 = vroundss_avx(auVar67,auVar67,0xb);
  iVar65 = (int)auVar67._0_4_;
  fVar80 = -0.08 / (fVar82 * fVar82);
  auVar68 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)ipoint->x),auVar74,0xf8);
  auVar68 = ZEXT416((uint)(ipoint->x + auVar68._0_4_));
  auVar68 = vroundss_avx(auVar68,auVar68,0xb);
  auVar69._0_8_ = (double)auVar68._0_4_;
  auVar69._8_8_ = auVar68._8_8_;
  auVar73._0_8_ = (double)fVar82;
  auVar73._8_8_ = 0;
  auVar68 = vfmadd231sd_fma(auVar69,auVar73,ZEXT816(0x3fe0000000000000));
  auVar72._0_4_ = (float)auVar68._0_8_;
  auVar72._4_12_ = auVar68._4_12_;
  auVar68 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)ipoint->y),auVar74,0xf8);
  auVar68 = ZEXT416((uint)(ipoint->y + auVar68._0_4_));
  auVar68 = vroundss_avx(auVar68,auVar68,0xb);
  auVar70._0_8_ = (double)auVar68._0_4_;
  auVar70._8_8_ = auVar68._8_8_;
  auVar68 = vfmadd231sd_fma(auVar70,auVar73,ZEXT816(0x3fe0000000000000));
  auVar71._0_4_ = (float)auVar68._0_8_;
  auVar71._4_12_ = auVar68._4_12_;
  auVar68._0_4_ = (int)auVar67._0_4_;
  auVar68._4_4_ = (int)auVar67._4_4_;
  auVar68._8_4_ = (int)auVar67._8_4_;
  auVar68._12_4_ = (int)auVar67._12_4_;
  auVar67 = vcvtdq2ps_avx(auVar68);
  fVar7 = auVar72._0_4_ - auVar67._0_4_;
  fVar8 = auVar71._0_4_ - auVar67._0_4_;
  auVar67 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar82),auVar72);
  auVar68 = vpternlogd_avx512vl(auVar75,auVar67,auVar74,0xf8);
  auVar67 = ZEXT416((uint)(auVar67._0_4_ + auVar68._0_4_));
  auVar67 = vroundss_avx(auVar67,auVar67,0xb);
  auVar68 = ZEXT416((uint)fVar82);
  if (iVar65 < (int)auVar67._0_4_) {
    auVar67 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar68,auVar71);
    auVar76._8_4_ = 0x3effffff;
    auVar76._0_8_ = 0x3effffff3effffff;
    auVar76._12_4_ = 0x3effffff;
    auVar77._8_4_ = 0x80000000;
    auVar77._0_8_ = 0x8000000080000000;
    auVar77._12_4_ = 0x80000000;
    auVar69 = vpternlogd_avx512vl(auVar77,auVar67,auVar76,0xea);
    auVar67 = ZEXT416((uint)(auVar67._0_4_ + auVar69._0_4_));
    auVar67 = vroundss_avx(auVar67,auVar67,0xb);
    if (iVar65 < (int)auVar67._0_4_) {
      auVar67 = vfmadd231ss_fma(auVar72,auVar68,ZEXT416(0x41300000));
      auVar78._8_4_ = 0x80000000;
      auVar78._0_8_ = 0x8000000080000000;
      auVar78._12_4_ = 0x80000000;
      auVar69 = vpternlogd_avx512vl(auVar78,auVar67,auVar76,0xea);
      auVar67 = ZEXT416((uint)(auVar67._0_4_ + auVar69._0_4_));
      auVar67 = vroundss_avx(auVar67,auVar67,0xb);
      if ((int)auVar67._0_4_ + iVar65 <= iimage->width) {
        auVar67 = vfmadd231ss_fma(auVar71,auVar68,ZEXT416(0x41300000));
        auVar17._8_4_ = 0x80000000;
        auVar17._0_8_ = 0x8000000080000000;
        auVar17._12_4_ = 0x80000000;
        auVar69 = vpternlogd_avx512vl(auVar76,auVar67,auVar17,0xf8);
        auVar67 = ZEXT416((uint)(auVar67._0_4_ + auVar69._0_4_));
        auVar67 = vroundss_avx(auVar67,auVar67,0xb);
        if ((int)auVar67._0_4_ + iVar65 <= iimage->height) {
          fVar7 = fVar7 + 0.5;
          fVar8 = fVar8 + 0.5;
          pfVar54 = iimage->data;
          iVar1 = iimage->data_width;
          iVar30 = iVar65 * 2;
          pfVar60 = haarResponseY + 0x7a;
          pfVar55 = haarResponseX + 0x7a;
          uVar25 = 0xfffffff4;
          do {
            auVar67._0_4_ = (float)(int)uVar25;
            auVar107 = in_ZMM8._4_12_;
            auVar67._4_12_ = auVar107;
            auVar67 = vfmadd213ss_fma(auVar67,auVar68,ZEXT416((uint)fVar8));
            iVar27 = (int)auVar67._0_4_;
            auVar96._0_4_ = (float)(int)(uVar25 | 1);
            auVar96._4_12_ = auVar107;
            auVar67 = vfmadd213ss_fma(auVar96,auVar68,ZEXT416((uint)fVar8));
            iVar23 = (int)auVar67._0_4_;
            auVar97._0_4_ = (float)(int)(uVar25 + 2);
            auVar97._4_12_ = auVar107;
            auVar69 = ZEXT416((uint)fVar8);
            auVar67 = vfmadd213ss_fma(auVar97,auVar68,auVar69);
            iVar35 = (int)auVar67._0_4_;
            auVar98._0_4_ = (float)(int)(uVar25 + 3);
            auVar98._4_12_ = auVar107;
            auVar67 = vfmadd213ss_fma(auVar98,auVar68,auVar69);
            iVar36 = (int)auVar67._0_4_;
            auVar99._0_4_ = (float)(int)(uVar25 + 4);
            auVar99._4_12_ = auVar107;
            auVar67 = vfmadd213ss_fma(auVar99,auVar68,auVar69);
            iVar22 = (int)auVar67._0_4_;
            auVar100._0_4_ = (float)(int)(uVar25 + 5);
            auVar100._4_12_ = auVar107;
            auVar67 = vfmadd213ss_fma(auVar100,auVar68,auVar69);
            iVar52 = (iVar27 + -1) * iVar1;
            iVar47 = (iVar27 + -1 + iVar65) * iVar1;
            iVar38 = (iVar27 + -1 + iVar30) * iVar1;
            iVar27 = (iVar23 + -1) * iVar1;
            iVar49 = (iVar23 + -1 + iVar65) * iVar1;
            iVar39 = (iVar23 + -1 + iVar30) * iVar1;
            iVar41 = (iVar35 + -1) * iVar1;
            iVar34 = (iVar35 + -1 + iVar65) * iVar1;
            iVar50 = (iVar35 + -1 + iVar30) * iVar1;
            iVar43 = (iVar36 + -1) * iVar1;
            iVar35 = (iVar36 + -1 + iVar65) * iVar1;
            iVar42 = (iVar36 + -1 + iVar30) * iVar1;
            iVar23 = (iVar22 + -1) * iVar1;
            iVar36 = (iVar22 + -1 + iVar65) * iVar1;
            iVar46 = (iVar22 + -1 + iVar30) * iVar1;
            iVar37 = (int)auVar67._0_4_;
            iVar51 = (iVar37 + -1) * iVar1;
            iVar22 = (iVar37 + -1 + iVar65) * iVar1;
            iVar37 = (iVar37 + -1 + iVar30) * iVar1;
            lVar63 = 0;
            do {
              iVar58 = (int)lVar63;
              auVar101._0_4_ = (float)(iVar58 + -0xc);
              auVar107 = auVar106._4_12_;
              auVar101._4_12_ = auVar107;
              auVar67 = vfmadd213ss_fma(auVar101,auVar68,ZEXT416((uint)fVar7));
              iVar28 = (int)auVar67._0_4_;
              auVar102._0_4_ = (float)(iVar58 + -0xb);
              auVar102._4_12_ = auVar107;
              auVar67 = vfmadd213ss_fma(auVar102,auVar68,ZEXT416((uint)fVar7));
              iVar53 = (int)auVar67._0_4_;
              auVar103._0_4_ = (float)(iVar58 + -10);
              auVar103._4_12_ = auVar107;
              auVar67 = vfmadd213ss_fma(auVar103,auVar68,ZEXT416((uint)fVar7));
              iVar59 = iVar28 + -1 + iVar65;
              iVar32 = iVar28 + -1 + iVar30;
              fVar82 = pfVar54[iVar47 + -1 + iVar28];
              fVar81 = pfVar54[iVar38 + -1 + iVar28];
              fVar87 = pfVar54[iVar38 + iVar32];
              fVar93 = pfVar54[iVar52 + -1 + iVar28];
              fVar9 = pfVar54[iVar52 + iVar32];
              auVar70 = SUB6416(ZEXT464(0x40000000),0);
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar52 + iVar59] -
                                                      pfVar54[iVar38 + iVar59])),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              fVar88 = pfVar54[iVar47 + iVar32];
              pfVar55[lVar63 + -0x7a] = (fVar81 - fVar9) + auVar69._0_4_;
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar88)),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              pfVar60[lVar63 + -0x7a] = auVar69._0_4_ - (fVar81 - fVar9);
              fVar82 = pfVar54[iVar49 + -1 + iVar28];
              fVar81 = pfVar54[iVar39 + -1 + iVar28];
              fVar87 = pfVar54[iVar39 + iVar32];
              fVar93 = pfVar54[iVar27 + -1 + iVar28];
              fVar9 = pfVar54[iVar27 + iVar32];
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar27 + iVar59] -
                                                      pfVar54[iVar39 + iVar59])),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              fVar88 = pfVar54[iVar49 + iVar32];
              pfVar55[lVar63 + -0x62] = (fVar81 - fVar9) + auVar69._0_4_;
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar88)),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              pfVar60[lVar63 + -0x62] = auVar69._0_4_ - (fVar81 - fVar9);
              fVar82 = pfVar54[iVar34 + -1 + iVar28];
              fVar81 = pfVar54[iVar50 + -1 + iVar28];
              fVar87 = pfVar54[iVar50 + iVar32];
              fVar93 = pfVar54[iVar41 + -1 + iVar28];
              fVar9 = pfVar54[iVar41 + iVar32];
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar41 + iVar59] -
                                                      pfVar54[iVar50 + iVar59])),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              fVar88 = pfVar54[iVar34 + iVar32];
              pfVar55[lVar63 + -0x4a] = (fVar81 - fVar9) + auVar69._0_4_;
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar88)),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              pfVar60[lVar63 + -0x4a] = auVar69._0_4_ - (fVar81 - fVar9);
              fVar82 = pfVar54[iVar35 + -1 + iVar28];
              fVar81 = pfVar54[iVar42 + -1 + iVar28];
              fVar87 = pfVar54[iVar42 + iVar32];
              fVar93 = pfVar54[iVar43 + -1 + iVar28];
              fVar9 = pfVar54[iVar43 + iVar32];
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar43 + iVar59] -
                                                      pfVar54[iVar42 + iVar59])),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              fVar88 = pfVar54[iVar35 + iVar32];
              pfVar55[lVar63 + -0x32] = (fVar81 - fVar9) + auVar69._0_4_;
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar88)),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              pfVar60[lVar63 + -0x32] = auVar69._0_4_ - (fVar81 - fVar9);
              fVar82 = pfVar54[iVar36 + -1 + iVar28];
              fVar81 = pfVar54[iVar46 + -1 + iVar28];
              fVar87 = pfVar54[iVar46 + iVar32];
              fVar93 = pfVar54[iVar23 + -1 + iVar28];
              fVar9 = pfVar54[iVar23 + iVar32];
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar23 + iVar59] -
                                                      pfVar54[iVar46 + iVar59])),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              fVar88 = pfVar54[iVar36 + iVar32];
              pfVar55[lVar63 + -0x1a] = (fVar81 - fVar9) + auVar69._0_4_;
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar88)),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              pfVar60[lVar63 + -0x1a] = auVar69._0_4_ - (fVar81 - fVar9);
              fVar82 = pfVar54[iVar22 + -1 + iVar28];
              fVar81 = pfVar54[iVar37 + -1 + iVar28];
              auVar106 = ZEXT464((uint)pfVar54[iVar32 + iVar37]);
              iVar24 = (int)auVar67._0_4_;
              fVar87 = pfVar54[iVar51 + iVar32];
              auVar69 = ZEXT416((uint)(pfVar54[iVar32 + iVar37] - pfVar54[iVar51 + -1 + iVar28]));
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar51 + iVar59] -
                                                      pfVar54[iVar59 + iVar37])),auVar70,auVar69);
              fVar93 = pfVar54[iVar22 + iVar32];
              pfVar55[lVar63 + -2] = (fVar81 - fVar87) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar93)),auVar70,auVar69);
              pfVar60[lVar63 + -2] = auVar67._0_4_ - (fVar81 - fVar87);
              iVar59 = iVar53 + -1 + iVar65;
              iVar32 = iVar53 + -1 + iVar30;
              fVar82 = pfVar54[iVar47 + -1 + iVar53];
              fVar81 = pfVar54[iVar38 + -1 + iVar53];
              fVar87 = pfVar54[iVar38 + iVar32];
              fVar93 = pfVar54[iVar52 + -1 + iVar53];
              fVar9 = pfVar54[iVar52 + iVar32];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar52 + iVar59] -
                                                      pfVar54[iVar38 + iVar59])),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              fVar88 = pfVar54[iVar47 + iVar32];
              pfVar55[lVar63 + -0x79] = (fVar81 - fVar9) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar88)),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              pfVar60[lVar63 + -0x79] = auVar67._0_4_ - (fVar81 - fVar9);
              fVar82 = pfVar54[iVar49 + -1 + iVar53];
              fVar81 = pfVar54[iVar39 + -1 + iVar53];
              fVar87 = pfVar54[iVar39 + iVar32];
              fVar93 = pfVar54[iVar27 + -1 + iVar53];
              fVar9 = pfVar54[iVar27 + iVar32];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar27 + iVar59] -
                                                      pfVar54[iVar39 + iVar59])),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              fVar88 = pfVar54[iVar49 + iVar32];
              pfVar55[lVar63 + -0x61] = (fVar81 - fVar9) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar88)),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              pfVar60[lVar63 + -0x61] = auVar67._0_4_ - (fVar81 - fVar9);
              fVar82 = pfVar54[iVar34 + -1 + iVar53];
              fVar81 = pfVar54[iVar50 + -1 + iVar53];
              fVar87 = pfVar54[iVar50 + iVar32];
              fVar93 = pfVar54[iVar41 + -1 + iVar53];
              fVar9 = pfVar54[iVar41 + iVar32];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar41 + iVar59] -
                                                      pfVar54[iVar50 + iVar59])),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              fVar88 = pfVar54[iVar34 + iVar32];
              pfVar55[lVar63 + -0x49] = (fVar81 - fVar9) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar88)),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              pfVar60[lVar63 + -0x49] = auVar67._0_4_ - (fVar81 - fVar9);
              fVar82 = pfVar54[iVar35 + -1 + iVar53];
              fVar81 = pfVar54[iVar42 + -1 + iVar53];
              fVar87 = pfVar54[iVar42 + iVar32];
              fVar93 = pfVar54[iVar43 + -1 + iVar53];
              fVar9 = pfVar54[iVar43 + iVar32];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar43 + iVar59] -
                                                      pfVar54[iVar42 + iVar59])),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              fVar88 = pfVar54[iVar35 + iVar32];
              pfVar55[lVar63 + -0x31] = (fVar81 - fVar9) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar88)),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              pfVar60[lVar63 + -0x31] = auVar67._0_4_ - (fVar81 - fVar9);
              fVar82 = pfVar54[iVar36 + -1 + iVar53];
              fVar81 = pfVar54[iVar46 + -1 + iVar53];
              fVar87 = pfVar54[iVar46 + iVar32];
              fVar93 = pfVar54[iVar23 + -1 + iVar53];
              fVar9 = pfVar54[iVar23 + iVar32];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar23 + iVar59] -
                                                      pfVar54[iVar46 + iVar59])),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              fVar88 = pfVar54[iVar36 + iVar32];
              pfVar55[lVar63 + -0x19] = (fVar81 - fVar9) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar88)),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              pfVar60[lVar63 + -0x19] = auVar67._0_4_ - (fVar81 - fVar9);
              fVar82 = pfVar54[iVar22 + -1 + iVar53];
              fVar81 = pfVar54[iVar37 + -1 + iVar53];
              fVar87 = pfVar54[iVar32 + iVar37];
              fVar93 = pfVar54[iVar51 + -1 + iVar53];
              fVar9 = pfVar54[iVar51 + iVar32];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar51 + iVar59] -
                                                      pfVar54[iVar59 + iVar37])),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              fVar88 = pfVar54[iVar22 + iVar32];
              pfVar55[lVar63 + -1] = (fVar81 - fVar9) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar88)),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              pfVar60[lVar63 + -1] = auVar67._0_4_ - (fVar81 - fVar9);
              iVar32 = iVar24 + -1 + iVar65;
              iVar59 = iVar24 + -1 + iVar30;
              fVar82 = pfVar54[iVar47 + -1 + iVar24];
              fVar81 = pfVar54[iVar38 + -1 + iVar24];
              fVar87 = pfVar54[iVar38 + iVar59];
              fVar93 = pfVar54[iVar52 + -1 + iVar24];
              fVar9 = pfVar54[iVar52 + iVar59];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar52 + iVar32] -
                                                      pfVar54[iVar38 + iVar32])),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              fVar88 = pfVar54[iVar47 + iVar59];
              pfVar55[lVar63 + -0x78] = (fVar81 - fVar9) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar88)),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              pfVar60[lVar63 + -0x78] = auVar67._0_4_ - (fVar81 - fVar9);
              fVar82 = pfVar54[iVar49 + -1 + iVar24];
              fVar81 = pfVar54[iVar39 + -1 + iVar24];
              fVar87 = pfVar54[iVar39 + iVar59];
              fVar93 = pfVar54[iVar27 + -1 + iVar24];
              fVar9 = pfVar54[iVar27 + iVar59];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar27 + iVar32] -
                                                      pfVar54[iVar39 + iVar32])),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              fVar88 = pfVar54[iVar49 + iVar59];
              pfVar55[lVar63 + -0x60] = (fVar81 - fVar9) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar88)),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              pfVar60[lVar63 + -0x60] = auVar67._0_4_ - (fVar81 - fVar9);
              fVar82 = pfVar54[iVar34 + -1 + iVar24];
              fVar81 = pfVar54[iVar50 + -1 + iVar24];
              fVar87 = pfVar54[iVar50 + iVar59];
              fVar93 = pfVar54[iVar41 + -1 + iVar24];
              fVar9 = pfVar54[iVar41 + iVar59];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar41 + iVar32] -
                                                      pfVar54[iVar50 + iVar32])),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              fVar88 = pfVar54[iVar34 + iVar59];
              pfVar55[lVar63 + -0x48] = (fVar81 - fVar9) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar88)),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              pfVar60[lVar63 + -0x48] = auVar67._0_4_ - (fVar81 - fVar9);
              fVar82 = pfVar54[iVar35 + -1 + iVar24];
              fVar81 = pfVar54[iVar42 + -1 + iVar24];
              fVar87 = pfVar54[iVar42 + iVar59];
              fVar93 = pfVar54[iVar43 + -1 + iVar24];
              fVar9 = pfVar54[iVar43 + iVar59];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar43 + iVar32] -
                                                      pfVar54[iVar42 + iVar32])),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              fVar88 = pfVar54[iVar35 + iVar59];
              pfVar55[lVar63 + -0x30] = (fVar81 - fVar9) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar88)),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              pfVar60[lVar63 + -0x30] = auVar67._0_4_ - (fVar81 - fVar9);
              fVar82 = pfVar54[iVar36 + -1 + iVar24];
              fVar81 = pfVar54[iVar46 + -1 + iVar24];
              fVar87 = pfVar54[iVar46 + iVar59];
              fVar93 = pfVar54[iVar23 + -1 + iVar24];
              fVar9 = pfVar54[iVar23 + iVar59];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar23 + iVar32] -
                                                      pfVar54[iVar46 + iVar32])),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              fVar88 = pfVar54[iVar36 + iVar59];
              pfVar55[lVar63 + -0x18] = (fVar81 - fVar9) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar88)),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              pfVar60[lVar63 + -0x18] = auVar67._0_4_ - (fVar81 - fVar9);
              fVar82 = pfVar54[iVar22 + -1 + iVar24];
              fVar81 = pfVar54[iVar37 + -1 + iVar24];
              fVar87 = pfVar54[iVar59 + iVar37];
              fVar93 = pfVar54[iVar51 + -1 + iVar24];
              fVar9 = pfVar54[iVar51 + iVar59];
              fVar88 = pfVar54[iVar22 + iVar59];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar51 + iVar32] -
                                                      pfVar54[iVar32 + iVar37])),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              pfVar55[lVar63] = (fVar81 - fVar9) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar88)),auVar70,
                                        ZEXT416((uint)(fVar87 - fVar93)));
              pfVar60[lVar63] = auVar67._0_4_ - (fVar81 - fVar9);
              lVar63 = lVar63 + 3;
            } while (iVar58 + -0xc < 9);
            pfVar60 = pfVar60 + 0x90;
            pfVar55 = pfVar55 + 0x90;
            bVar2 = (int)uVar25 < 6;
            uVar25 = uVar25 + 6;
          } while (bVar2);
          goto LAB_002629fd;
        }
      }
    }
  }
  iVar1 = iVar65 * 2;
  lVar63 = 0;
  uVar25 = 0xfffffff4;
  do {
    auVar67 = vpbroadcastd_avx512vl();
    auVar67 = vpaddd_avx(auVar67,_DAT_005766e0);
    auVar85._0_4_ = (float)(int)uVar25;
    auVar85._4_12_ = in_ZMM8._4_12_;
    auVar69 = vfmadd213ss_fma(auVar85,auVar110._0_16_,ZEXT416((uint)fVar8));
    auVar89._0_4_ = (float)(int)(uVar25 | 1);
    auVar89._4_12_ = in_ZMM8._4_12_;
    auVar70 = vfmadd213ss_fma(auVar89,auVar110._0_16_,ZEXT416((uint)fVar8));
    fVar81 = auVar69._0_4_;
    iVar22 = (int)((double)((ulong)(0.0 <= fVar81) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar81) * -0x4020000000000000) + (double)fVar81);
    fVar81 = auVar70._0_4_;
    auVar67 = vcvtdq2ps_avx(auVar67);
    auVar20._4_4_ = fVar8;
    auVar20._0_4_ = fVar8;
    auVar20._8_4_ = fVar8;
    auVar20._12_4_ = fVar8;
    auVar21._4_4_ = fVar82;
    auVar21._0_4_ = fVar82;
    auVar21._8_4_ = fVar82;
    auVar21._12_4_ = fVar82;
    auVar67 = vfmadd132ps_fma(auVar67,auVar20,auVar21);
    uVar26 = vcmpps_avx512vl(auVar67,_DAT_00576190,0xd);
    auVar6 = vcvtps2pd_avx(auVar67);
    auVar92._8_8_ = 0xbfe0000000000000;
    auVar92._0_8_ = 0xbfe0000000000000;
    auVar92._16_8_ = 0xbfe0000000000000;
    auVar92._24_8_ = 0xbfe0000000000000;
    auVar79._12_4_ = 0x3fe00000;
    auVar79._0_12_ = ZEXT812(0x3fe0000000000000);
    auVar79._16_8_ = 0x3fe0000000000000;
    auVar79._24_8_ = 0x3fe0000000000000;
    auVar79 = vblendmpd_avx512vl(auVar92,auVar79);
    bVar2 = (bool)((byte)uVar26 & 1);
    bVar3 = (bool)((byte)(uVar26 >> 1) & 1);
    bVar4 = (bool)((byte)(uVar26 >> 2) & 1);
    bVar5 = (bool)((byte)(uVar26 >> 3) & 1);
    auVar83._0_4_ =
         (int)((double)((ulong)bVar2 * auVar79._0_8_ | (ulong)!bVar2 * -0x4020000000000000) +
              auVar6._0_8_);
    auVar83._4_4_ =
         (int)((double)((ulong)bVar3 * auVar79._8_8_ | (ulong)!bVar3 * -0x4020000000000000) +
              auVar6._8_8_);
    auVar83._8_4_ =
         (int)((double)((ulong)bVar4 * auVar79._16_8_ | (ulong)!bVar4 * -0x4020000000000000) +
              auVar6._16_8_);
    auVar83._12_4_ =
         (int)((double)((ulong)bVar5 * auVar79._24_8_ | (ulong)!bVar5 * -0x4020000000000000) +
              auVar6._24_8_);
    iVar27 = (int)((double)((ulong)(0.0 <= fVar81) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar81) * -0x4020000000000000) + (double)fVar81);
    iVar34 = iVar1 + iVar22;
    iVar35 = iVar22 + -1 + iVar65;
    iVar36 = iVar22 + -1;
    iVar37 = iVar1 + iVar27;
    iVar38 = iVar27 + -1 + iVar65;
    iVar39 = iVar27 + -1;
    iVar41 = iVar1 + auVar83._12_4_;
    iVar42 = auVar83._12_4_ + -1 + iVar65;
    auVar18._8_4_ = 1;
    auVar18._0_8_ = 0x100000001;
    auVar18._12_4_ = 1;
    uVar26 = vpcmpd_avx512vl(auVar83,auVar18,1);
    uVar66 = uVar26 & 0xf;
    uVar33 = uVar66 >> 1;
    uVar29 = uVar66 >> 2;
    uVar66 = uVar66 >> 3;
    iVar43 = auVar83._12_4_ + -1;
    iVar46 = iVar1 + auVar83._8_4_;
    iVar47 = auVar83._8_4_ + -1 + iVar65;
    iVar49 = auVar83._8_4_ + -1;
    iVar50 = iVar1 + auVar83._4_4_;
    iVar51 = auVar83._4_4_ + -1 + iVar65;
    iVar52 = auVar83._4_4_ + -1;
    iVar58 = iVar1 + auVar83._0_4_;
    iVar59 = auVar83._0_4_ + -1 + iVar65;
    iVar23 = auVar83._0_4_ + -1;
    lVar62 = lVar63;
    iVar30 = -0xc;
    do {
      auVar84._0_4_ = (float)iVar30;
      auVar107 = auVar106._4_12_;
      auVar84._4_12_ = auVar107;
      auVar70 = auVar110._0_16_;
      auVar67 = vfmadd213ss_fma(auVar84,auVar70,ZEXT416((uint)fVar7));
      auVar94._0_4_ = (float)(iVar30 + 1);
      auVar94._4_12_ = auVar107;
      auVar69 = vfmadd213ss_fma(auVar94,auVar70,ZEXT416((uint)fVar7));
      auVar90._0_4_ = (float)(iVar30 + 2);
      auVar90._4_12_ = auVar107;
      auVar70 = vfmadd213ss_fma(auVar90,auVar70,ZEXT416((uint)fVar7));
      fVar81 = auVar67._0_4_;
      fVar93 = auVar69._0_4_;
      fVar87 = auVar70._0_4_;
      pfVar54 = (float *)((long)haarResponseY + lVar62);
      iVar32 = (int)((double)((ulong)(0.0 <= fVar81) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar81) * -0x4020000000000000) + (double)fVar81);
      if ((((iVar22 < 1) || (iVar32 < 1)) || (iimage->height < iVar34)) ||
         (iVar24 = iVar1 + iVar32, iimage->width < iVar24)) {
        auVar106 = ZEXT1664(auVar106._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar22,iVar32,iVar65,(float *)((long)haarResponseX + lVar62),pfVar54);
      }
      else {
        iVar40 = iVar32 + -1 + iVar65;
        pfVar55 = iimage->data;
        iVar53 = iimage->data_width;
        iVar28 = iVar53 * iVar36;
        fVar81 = pfVar55[iVar53 * iVar35 + -1 + iVar32];
        iVar44 = iVar53 * (iVar1 + -1 + iVar22);
        fVar9 = pfVar55[iVar44 + -1 + iVar32];
        fVar88 = pfVar55[iVar44 + -1 + iVar24];
        fVar10 = pfVar55[iVar28 + -1 + iVar32];
        fVar11 = pfVar55[iVar28 + -1 + iVar24];
        fVar12 = pfVar55[iVar53 * iVar35 + -1 + iVar24];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar55[iVar28 + iVar40] - pfVar55[iVar44 + iVar40]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar88 - fVar10)));
        *(float *)((long)haarResponseX + lVar62) = (fVar9 - fVar11) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar88 - fVar10)));
        *pfVar54 = auVar67._0_4_ - (fVar9 - fVar11);
      }
      pfVar54 = (float *)((long)haarResponseX + lVar62 + 0x60);
      pfVar55 = (float *)((long)haarResponseY + lVar62 + 0x60);
      if (((iVar27 < 1) || (iVar32 < 1)) ||
         ((iimage->height < iVar37 || (iVar24 = iVar1 + iVar32, iimage->width < iVar24)))) {
        auVar106 = ZEXT1664(auVar106._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar27,iVar32,iVar65,pfVar54,pfVar55);
      }
      else {
        iVar40 = iVar32 + -1 + iVar65;
        pfVar60 = iimage->data;
        iVar53 = iimage->data_width;
        iVar28 = iVar53 * iVar39;
        fVar81 = pfVar60[iVar53 * iVar38 + -1 + iVar32];
        iVar44 = iVar53 * (iVar1 + -1 + iVar27);
        fVar9 = pfVar60[iVar44 + -1 + iVar32];
        fVar88 = pfVar60[iVar44 + -1 + iVar24];
        fVar10 = pfVar60[iVar28 + -1 + iVar32];
        fVar11 = pfVar60[iVar28 + -1 + iVar24];
        fVar12 = pfVar60[iVar53 * iVar38 + -1 + iVar24];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar60[iVar28 + iVar40] - pfVar60[iVar44 + iVar40]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar88 - fVar10)));
        *pfVar54 = (fVar9 - fVar11) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar88 - fVar10)));
        *pfVar55 = auVar67._0_4_ - (fVar9 - fVar11);
      }
      pfVar54 = (float *)((long)haarResponseX + lVar62 + 0xc0);
      pfVar55 = (float *)((long)haarResponseY + lVar62 + 0xc0);
      if (((iVar32 < 1 || uVar66 != 0) || (iimage->height < iVar41)) ||
         (iVar24 = iVar1 + iVar32, iimage->width < iVar24)) {
        auVar106 = ZEXT1664(auVar106._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar83._12_4_,iVar32,iVar65,pfVar54,pfVar55);
      }
      else {
        iVar40 = iVar32 + -1 + iVar65;
        pfVar60 = iimage->data;
        iVar53 = iimage->data_width;
        iVar28 = iVar53 * iVar43;
        fVar81 = pfVar60[iVar53 * iVar42 + -1 + iVar32];
        iVar44 = iVar53 * (iVar1 + -1 + auVar83._12_4_);
        fVar9 = pfVar60[iVar44 + -1 + iVar32];
        fVar88 = pfVar60[iVar44 + -1 + iVar24];
        fVar10 = pfVar60[iVar28 + -1 + iVar32];
        fVar11 = pfVar60[iVar28 + -1 + iVar24];
        fVar12 = pfVar60[iVar53 * iVar42 + -1 + iVar24];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar60[iVar28 + iVar40] - pfVar60[iVar44 + iVar40]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar88 - fVar10)));
        *pfVar54 = (fVar9 - fVar11) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar88 - fVar10)));
        *pfVar55 = auVar67._0_4_ - (fVar9 - fVar11);
      }
      pfVar54 = (float *)((long)haarResponseX + lVar62 + 0x120);
      pfVar55 = (float *)((long)haarResponseY + lVar62 + 0x120);
      if (((iVar32 < 1 || (uVar29 & 1) != 0) || (iimage->height < iVar46)) ||
         (iVar24 = iVar1 + iVar32, iimage->width < iVar24)) {
        auVar106 = ZEXT1664(auVar106._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar83._8_4_,iVar32,iVar65,pfVar54,pfVar55);
      }
      else {
        iVar40 = iVar32 + -1 + iVar65;
        pfVar60 = iimage->data;
        iVar53 = iimage->data_width;
        iVar28 = iVar53 * iVar49;
        fVar81 = pfVar60[iVar53 * iVar47 + -1 + iVar32];
        iVar44 = iVar53 * (iVar1 + -1 + auVar83._8_4_);
        fVar9 = pfVar60[iVar44 + -1 + iVar32];
        fVar88 = pfVar60[iVar44 + -1 + iVar24];
        fVar10 = pfVar60[iVar28 + -1 + iVar32];
        fVar11 = pfVar60[iVar28 + -1 + iVar24];
        fVar12 = pfVar60[iVar53 * iVar47 + -1 + iVar24];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar60[iVar28 + iVar40] - pfVar60[iVar44 + iVar40]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar88 - fVar10)));
        *pfVar54 = (fVar9 - fVar11) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar88 - fVar10)));
        *pfVar55 = auVar67._0_4_ - (fVar9 - fVar11);
      }
      pfVar54 = (float *)((long)haarResponseX + lVar62 + 0x180);
      pfVar55 = (float *)((long)haarResponseY + lVar62 + 0x180);
      if (((iVar32 < 1 || (uVar33 & 1) != 0) || (iimage->height < iVar50)) ||
         (iVar24 = iVar1 + iVar32, iimage->width < iVar24)) {
        auVar106 = ZEXT1664(auVar106._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar83._4_4_,iVar32,iVar65,pfVar54,pfVar55);
      }
      else {
        iVar40 = iVar32 + -1 + iVar65;
        pfVar60 = iimage->data;
        iVar53 = iimage->data_width;
        iVar28 = iVar53 * iVar52;
        fVar81 = pfVar60[iVar53 * iVar51 + -1 + iVar32];
        iVar44 = iVar53 * (iVar1 + -1 + auVar83._4_4_);
        fVar9 = pfVar60[iVar44 + -1 + iVar32];
        fVar88 = pfVar60[iVar44 + -1 + iVar24];
        fVar10 = pfVar60[iVar28 + -1 + iVar32];
        fVar11 = pfVar60[iVar28 + -1 + iVar24];
        fVar12 = pfVar60[iVar53 * iVar51 + -1 + iVar24];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar60[iVar28 + iVar40] - pfVar60[iVar44 + iVar40]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar88 - fVar10)));
        *pfVar54 = (fVar9 - fVar11) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar88 - fVar10)));
        *pfVar55 = auVar67._0_4_ - (fVar9 - fVar11);
      }
      pfVar54 = (float *)((long)haarResponseX + lVar62 + 0x1e0);
      pfVar55 = (float *)((long)haarResponseY + lVar62 + 0x1e0);
      if (((iVar32 < 1 || (uVar26 & 1) != 0) || (iimage->height < iVar58)) ||
         (iVar24 = iVar1 + iVar32, iimage->width < iVar24)) {
        auVar106 = ZEXT1664(auVar106._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar83._0_4_,iVar32,iVar65,pfVar54,pfVar55);
      }
      else {
        iVar28 = iVar32 + -1 + iVar65;
        pfVar60 = iimage->data;
        iVar53 = iimage->data_width;
        iVar44 = iVar53 * iVar23;
        fVar81 = pfVar60[iVar53 * iVar59 + -1 + iVar32];
        iVar40 = iVar53 * (iVar1 + -1 + auVar83._0_4_);
        fVar9 = pfVar60[iVar40 + -1 + iVar32];
        fVar88 = pfVar60[iVar40 + -1 + iVar24];
        fVar10 = pfVar60[iVar44 + -1 + iVar32];
        fVar11 = pfVar60[iVar44 + -1 + iVar24];
        fVar12 = pfVar60[iVar53 * iVar59 + -1 + iVar24];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar60[iVar44 + iVar28] - pfVar60[iVar40 + iVar28]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar88 - fVar10)));
        *pfVar54 = (fVar9 - fVar11) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar88 - fVar10)));
        *pfVar55 = auVar67._0_4_ - (fVar9 - fVar11);
      }
      iVar32 = (int)((double)((ulong)(0.0 <= fVar93) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar93) * -0x4020000000000000) + (double)fVar93);
      pfVar54 = (float *)((long)haarResponseX + lVar62 + 4);
      pfVar55 = (float *)((long)haarResponseY + lVar62 + 4);
      if ((((iVar22 < 1) || (iVar32 < 1)) || (iimage->height < iVar34)) ||
         (iVar24 = iVar1 + iVar32, iimage->width < iVar24)) {
        auVar106 = ZEXT1664(auVar106._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar22,iVar32,iVar65,pfVar54,pfVar55);
      }
      else {
        iVar40 = iVar32 + -1 + iVar65;
        pfVar60 = iimage->data;
        iVar53 = iimage->data_width;
        iVar28 = iVar53 * iVar36;
        fVar81 = pfVar60[iVar53 * iVar35 + -1 + iVar32];
        iVar44 = iVar53 * (iVar1 + -1 + iVar22);
        fVar93 = pfVar60[iVar44 + -1 + iVar32];
        fVar9 = pfVar60[iVar44 + -1 + iVar24];
        fVar88 = pfVar60[iVar28 + -1 + iVar32];
        fVar10 = pfVar60[iVar28 + -1 + iVar24];
        fVar11 = pfVar60[iVar53 * iVar35 + -1 + iVar24];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar60[iVar28 + iVar40] - pfVar60[iVar44 + iVar40]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar88)));
        *pfVar54 = (fVar93 - fVar10) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar88)));
        *pfVar55 = auVar67._0_4_ - (fVar93 - fVar10);
      }
      pfVar54 = (float *)((long)haarResponseX + lVar62 + 100);
      pfVar55 = (float *)((long)haarResponseY + lVar62 + 100);
      if (((iVar27 < 1) || (iVar32 < 1)) ||
         ((iimage->height < iVar37 || (iVar24 = iVar1 + iVar32, iimage->width < iVar24)))) {
        auVar106 = ZEXT1664(auVar106._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar27,iVar32,iVar65,pfVar54,pfVar55);
      }
      else {
        iVar40 = iVar32 + -1 + iVar65;
        pfVar60 = iimage->data;
        iVar53 = iimage->data_width;
        iVar28 = iVar53 * iVar39;
        fVar81 = pfVar60[iVar53 * iVar38 + -1 + iVar32];
        iVar44 = iVar53 * (iVar1 + -1 + iVar27);
        fVar93 = pfVar60[iVar44 + -1 + iVar32];
        fVar9 = pfVar60[iVar44 + -1 + iVar24];
        fVar88 = pfVar60[iVar28 + -1 + iVar32];
        fVar10 = pfVar60[iVar28 + -1 + iVar24];
        fVar11 = pfVar60[iVar53 * iVar38 + -1 + iVar24];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar60[iVar28 + iVar40] - pfVar60[iVar44 + iVar40]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar88)));
        *pfVar54 = (fVar93 - fVar10) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar88)));
        *pfVar55 = auVar67._0_4_ - (fVar93 - fVar10);
      }
      pfVar54 = (float *)((long)haarResponseX + lVar62 + 0xc4);
      pfVar55 = (float *)((long)haarResponseY + lVar62 + 0xc4);
      if (((iVar32 < 1 || uVar66 != 0) || (iimage->height < iVar41)) ||
         (iVar24 = iVar1 + iVar32, iimage->width < iVar24)) {
        auVar106 = ZEXT1664(auVar106._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar83._12_4_,iVar32,iVar65,pfVar54,pfVar55);
      }
      else {
        iVar40 = iVar32 + -1 + iVar65;
        pfVar60 = iimage->data;
        iVar53 = iimage->data_width;
        iVar28 = iVar53 * iVar43;
        fVar81 = pfVar60[iVar53 * iVar42 + -1 + iVar32];
        iVar44 = iVar53 * (iVar1 + -1 + auVar83._12_4_);
        fVar93 = pfVar60[iVar44 + -1 + iVar32];
        fVar9 = pfVar60[iVar44 + -1 + iVar24];
        fVar88 = pfVar60[iVar28 + -1 + iVar32];
        fVar10 = pfVar60[iVar28 + -1 + iVar24];
        fVar11 = pfVar60[iVar53 * iVar42 + -1 + iVar24];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar60[iVar28 + iVar40] - pfVar60[iVar44 + iVar40]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar88)));
        *pfVar54 = (fVar93 - fVar10) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar88)));
        *pfVar55 = auVar67._0_4_ - (fVar93 - fVar10);
      }
      pfVar54 = (float *)((long)haarResponseX + lVar62 + 0x124);
      pfVar55 = (float *)((long)haarResponseY + lVar62 + 0x124);
      if (((iVar32 < 1 || (uVar29 & 1) != 0) || (iimage->height < iVar46)) ||
         (iVar24 = iVar1 + iVar32, iimage->width < iVar24)) {
        auVar106 = ZEXT1664(auVar106._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar83._8_4_,iVar32,iVar65,pfVar54,pfVar55);
      }
      else {
        iVar40 = iVar32 + -1 + iVar65;
        pfVar60 = iimage->data;
        iVar53 = iimage->data_width;
        iVar28 = iVar53 * iVar49;
        fVar81 = pfVar60[iVar53 * iVar47 + -1 + iVar32];
        iVar44 = iVar53 * (iVar1 + -1 + auVar83._8_4_);
        fVar93 = pfVar60[iVar44 + -1 + iVar32];
        fVar9 = pfVar60[iVar44 + -1 + iVar24];
        fVar88 = pfVar60[iVar28 + -1 + iVar32];
        fVar10 = pfVar60[iVar28 + -1 + iVar24];
        fVar11 = pfVar60[iVar53 * iVar47 + -1 + iVar24];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar60[iVar28 + iVar40] - pfVar60[iVar44 + iVar40]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar88)));
        *pfVar54 = (fVar93 - fVar10) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar88)));
        *pfVar55 = auVar67._0_4_ - (fVar93 - fVar10);
      }
      pfVar54 = (float *)((long)haarResponseX + lVar62 + 0x184);
      pfVar55 = (float *)((long)haarResponseY + lVar62 + 0x184);
      if (((iVar32 < 1 || (uVar33 & 1) != 0) || (iimage->height < iVar50)) ||
         (iVar24 = iVar1 + iVar32, iimage->width < iVar24)) {
        auVar106 = ZEXT1664(auVar106._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar83._4_4_,iVar32,iVar65,pfVar54,pfVar55);
      }
      else {
        iVar40 = iVar32 + -1 + iVar65;
        pfVar60 = iimage->data;
        iVar53 = iimage->data_width;
        iVar28 = iVar53 * iVar52;
        fVar81 = pfVar60[iVar53 * iVar51 + -1 + iVar32];
        iVar44 = iVar53 * (iVar1 + -1 + auVar83._4_4_);
        fVar93 = pfVar60[iVar44 + -1 + iVar32];
        fVar9 = pfVar60[iVar44 + -1 + iVar24];
        fVar88 = pfVar60[iVar28 + -1 + iVar32];
        fVar10 = pfVar60[iVar28 + -1 + iVar24];
        fVar11 = pfVar60[iVar53 * iVar51 + -1 + iVar24];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar60[iVar28 + iVar40] - pfVar60[iVar44 + iVar40]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar88)));
        *pfVar54 = (fVar93 - fVar10) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar88)));
        *pfVar55 = auVar67._0_4_ - (fVar93 - fVar10);
      }
      pfVar54 = (float *)((long)haarResponseX + lVar62 + 0x1e4);
      pfVar55 = (float *)((long)haarResponseY + lVar62 + 0x1e4);
      if (((iVar32 < 1 || (uVar26 & 1) != 0) || (iimage->height < iVar58)) ||
         (iVar24 = iVar1 + iVar32, iimage->width < iVar24)) {
        auVar106 = ZEXT1664(auVar106._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar83._0_4_,iVar32,iVar65,pfVar54,pfVar55);
      }
      else {
        iVar28 = iVar32 + -1 + iVar65;
        pfVar60 = iimage->data;
        iVar53 = iimage->data_width;
        iVar44 = iVar53 * iVar23;
        fVar81 = pfVar60[iVar53 * iVar59 + -1 + iVar32];
        iVar40 = iVar53 * (iVar1 + -1 + auVar83._0_4_);
        fVar93 = pfVar60[iVar40 + -1 + iVar32];
        fVar9 = pfVar60[iVar40 + -1 + iVar24];
        fVar88 = pfVar60[iVar44 + -1 + iVar32];
        fVar10 = pfVar60[iVar44 + -1 + iVar24];
        fVar11 = pfVar60[iVar53 * iVar59 + -1 + iVar24];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar60[iVar44 + iVar28] - pfVar60[iVar40 + iVar28]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar88)));
        *pfVar54 = (fVar93 - fVar10) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar88)));
        *pfVar55 = auVar67._0_4_ - (fVar93 - fVar10);
      }
      iVar32 = (int)((double)((ulong)(0.0 <= fVar87) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar87) * -0x4020000000000000) + (double)fVar87);
      pfVar54 = (float *)((long)haarResponseX + lVar62 + 8);
      pfVar55 = (float *)((long)haarResponseY + lVar62 + 8);
      if ((((iVar22 < 1) || (iVar32 < 1)) || (iimage->height < iVar34)) ||
         (iVar24 = iVar1 + iVar32, iimage->width < iVar24)) {
        auVar106 = ZEXT1664(auVar106._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar22,iVar32,iVar65,pfVar54,pfVar55);
      }
      else {
        iVar40 = iVar32 + -1 + iVar65;
        pfVar60 = iimage->data;
        iVar53 = iimage->data_width;
        iVar28 = iVar53 * iVar36;
        fVar81 = pfVar60[iVar53 * iVar35 + -1 + iVar32];
        iVar44 = iVar53 * (iVar1 + -1 + iVar22);
        fVar87 = pfVar60[iVar44 + -1 + iVar32];
        fVar93 = pfVar60[iVar44 + -1 + iVar24];
        fVar9 = pfVar60[iVar28 + -1 + iVar32];
        fVar88 = pfVar60[iVar28 + -1 + iVar24];
        fVar10 = pfVar60[iVar53 * iVar35 + -1 + iVar24];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar60[iVar28 + iVar40] - pfVar60[iVar44 + iVar40]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar93 - fVar9)));
        *pfVar54 = (fVar87 - fVar88) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar10)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar93 - fVar9)));
        *pfVar55 = auVar67._0_4_ - (fVar87 - fVar88);
      }
      pfVar54 = (float *)((long)haarResponseX + lVar62 + 0x68);
      pfVar55 = (float *)((long)haarResponseY + lVar62 + 0x68);
      if (((iVar27 < 1) || (iVar32 < 1)) ||
         ((iimage->height < iVar37 || (iVar24 = iVar1 + iVar32, iimage->width < iVar24)))) {
        auVar106 = ZEXT1664(auVar106._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar27,iVar32,iVar65,pfVar54,pfVar55);
      }
      else {
        iVar40 = iVar32 + -1 + iVar65;
        pfVar60 = iimage->data;
        iVar53 = iimage->data_width;
        iVar28 = iVar53 * iVar39;
        fVar81 = pfVar60[iVar53 * iVar38 + -1 + iVar32];
        iVar44 = iVar53 * (iVar1 + -1 + iVar27);
        fVar87 = pfVar60[iVar44 + -1 + iVar32];
        fVar93 = pfVar60[iVar44 + -1 + iVar24];
        fVar9 = pfVar60[iVar28 + -1 + iVar32];
        fVar88 = pfVar60[iVar28 + -1 + iVar24];
        fVar10 = pfVar60[iVar53 * iVar38 + -1 + iVar24];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar60[iVar28 + iVar40] - pfVar60[iVar44 + iVar40]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar93 - fVar9)));
        *pfVar54 = (fVar87 - fVar88) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar10)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar93 - fVar9)));
        *pfVar55 = auVar67._0_4_ - (fVar87 - fVar88);
      }
      pfVar54 = (float *)((long)haarResponseX + lVar62 + 200);
      pfVar55 = (float *)((long)haarResponseY + lVar62 + 200);
      if (((iVar32 < 1 || uVar66 != 0) || (iimage->height < iVar41)) ||
         (iVar24 = iVar1 + iVar32, iimage->width < iVar24)) {
        auVar106 = ZEXT1664(auVar106._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar83._12_4_,iVar32,iVar65,pfVar54,pfVar55);
      }
      else {
        iVar40 = iVar32 + -1 + iVar65;
        pfVar60 = iimage->data;
        iVar53 = iimage->data_width;
        iVar28 = iVar53 * iVar43;
        fVar81 = pfVar60[iVar53 * iVar42 + -1 + iVar32];
        iVar44 = iVar53 * (iVar1 + -1 + auVar83._12_4_);
        fVar87 = pfVar60[iVar44 + -1 + iVar32];
        fVar93 = pfVar60[iVar44 + -1 + iVar24];
        fVar9 = pfVar60[iVar28 + -1 + iVar32];
        fVar88 = pfVar60[iVar28 + -1 + iVar24];
        fVar10 = pfVar60[iVar53 * iVar42 + -1 + iVar24];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar60[iVar28 + iVar40] - pfVar60[iVar44 + iVar40]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar93 - fVar9)));
        *pfVar54 = (fVar87 - fVar88) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar10)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar93 - fVar9)));
        *pfVar55 = auVar67._0_4_ - (fVar87 - fVar88);
      }
      pfVar54 = (float *)((long)haarResponseX + lVar62 + 0x128);
      pfVar55 = (float *)((long)haarResponseY + lVar62 + 0x128);
      if (((iVar32 < 1 || (uVar29 & 1) != 0) || (iimage->height < iVar46)) ||
         (iVar24 = iVar1 + iVar32, iimage->width < iVar24)) {
        auVar106 = ZEXT1664(auVar106._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar83._8_4_,iVar32,iVar65,pfVar54,pfVar55);
      }
      else {
        iVar40 = iVar32 + -1 + iVar65;
        pfVar60 = iimage->data;
        iVar53 = iimage->data_width;
        iVar28 = iVar53 * iVar49;
        fVar81 = pfVar60[iVar53 * iVar47 + -1 + iVar32];
        iVar44 = iVar53 * (iVar1 + -1 + auVar83._8_4_);
        fVar87 = pfVar60[iVar44 + -1 + iVar32];
        fVar93 = pfVar60[iVar44 + -1 + iVar24];
        fVar9 = pfVar60[iVar28 + -1 + iVar32];
        fVar88 = pfVar60[iVar28 + -1 + iVar24];
        fVar10 = pfVar60[iVar53 * iVar47 + -1 + iVar24];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar60[iVar28 + iVar40] - pfVar60[iVar44 + iVar40]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar93 - fVar9)));
        *pfVar54 = (fVar87 - fVar88) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar10)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar93 - fVar9)));
        *pfVar55 = auVar67._0_4_ - (fVar87 - fVar88);
      }
      pfVar54 = (float *)((long)haarResponseX + lVar62 + 0x188);
      pfVar55 = (float *)((long)haarResponseY + lVar62 + 0x188);
      if (((iVar32 < 1 || (uVar33 & 1) != 0) || (iimage->height < iVar50)) ||
         (iVar24 = iVar1 + iVar32, iimage->width < iVar24)) {
        auVar106 = ZEXT1664(auVar106._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar83._4_4_,iVar32,iVar65,pfVar54,pfVar55);
      }
      else {
        iVar40 = iVar32 + -1 + iVar65;
        pfVar60 = iimage->data;
        iVar53 = iimage->data_width;
        iVar28 = iVar53 * iVar52;
        fVar81 = pfVar60[iVar53 * iVar51 + -1 + iVar32];
        iVar44 = iVar53 * (iVar1 + -1 + auVar83._4_4_);
        fVar87 = pfVar60[iVar44 + -1 + iVar32];
        fVar93 = pfVar60[iVar44 + -1 + iVar24];
        fVar9 = pfVar60[iVar28 + -1 + iVar32];
        fVar88 = pfVar60[iVar28 + -1 + iVar24];
        fVar10 = pfVar60[iVar53 * iVar51 + -1 + iVar24];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar60[iVar28 + iVar40] - pfVar60[iVar44 + iVar40]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar93 - fVar9)));
        *pfVar54 = (fVar87 - fVar88) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar10)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar93 - fVar9)));
        *pfVar55 = auVar67._0_4_ - (fVar87 - fVar88);
      }
      pfVar54 = (float *)((long)haarResponseX + lVar62 + 0x1e8);
      pfVar55 = (float *)((long)haarResponseY + lVar62 + 0x1e8);
      if (((iVar32 < 1 || (uVar26 & 1) != 0) || (iimage->height < iVar58)) ||
         (iVar24 = iVar1 + iVar32, iimage->width < iVar24)) {
        auVar106 = ZEXT1664(auVar106._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar83._0_4_,iVar32,iVar65,pfVar54,pfVar55);
      }
      else {
        iVar28 = iVar32 + -1 + iVar65;
        pfVar60 = iimage->data;
        iVar53 = iimage->data_width;
        iVar44 = iVar53 * iVar23;
        fVar81 = pfVar60[iVar53 * iVar59 + -1 + iVar32];
        iVar40 = iVar53 * (iVar1 + -1 + auVar83._0_4_);
        fVar87 = pfVar60[iVar40 + -1 + iVar32];
        fVar93 = pfVar60[iVar40 + -1 + iVar24];
        fVar9 = pfVar60[iVar44 + -1 + iVar32];
        fVar88 = pfVar60[iVar44 + -1 + iVar24];
        fVar10 = pfVar60[iVar53 * iVar59 + -1 + iVar24];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar60[iVar44 + iVar28] - pfVar60[iVar40 + iVar28]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar93 - fVar9)));
        *pfVar54 = (fVar87 - fVar88) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar10)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar93 - fVar9)));
        *pfVar55 = auVar67._0_4_ - (fVar87 - fVar88);
      }
      auVar110 = ZEXT1664(auVar68);
      lVar62 = lVar62 + 0xc;
      bVar2 = iVar30 < 9;
      iVar30 = iVar30 + 3;
    } while (bVar2);
    lVar63 = lVar63 + 0x240;
    bVar2 = (int)uVar25 < 6;
    uVar25 = uVar25 + 6;
  } while (bVar2);
LAB_002629fd:
  fVar82 = auVar110._0_4_;
  auVar109._8_4_ = 0x3effffff;
  auVar109._0_8_ = 0x3effffff3effffff;
  auVar109._12_4_ = 0x3effffff;
  auVar108._8_4_ = 0x80000000;
  auVar108._0_8_ = 0x8000000080000000;
  auVar108._12_4_ = 0x80000000;
  auVar67 = vpternlogd_avx512vl(auVar109,ZEXT416((uint)(fVar82 * 0.5)),auVar108,0xf8);
  auVar67 = ZEXT416((uint)(fVar82 * 0.5 + auVar67._0_4_));
  auVar67 = vroundss_avx(auVar67,auVar67,0xb);
  auVar68 = vpternlogd_avx512vl(auVar109,ZEXT416((uint)(fVar82 * 1.5)),auVar108,0xf8);
  auVar68 = ZEXT416((uint)(fVar82 * 1.5 + auVar68._0_4_));
  auVar68 = vroundss_avx(auVar68,auVar68,0xb);
  auVar69 = vpternlogd_avx512vl(auVar109,ZEXT416((uint)(fVar82 * 2.5)),auVar108,0xf8);
  auVar69 = ZEXT416((uint)(fVar82 * 2.5 + auVar69._0_4_));
  auVar69 = vroundss_avx(auVar69,auVar69,0xb);
  auVar70 = vpternlogd_avx512vl(auVar109,ZEXT416((uint)(fVar82 * 3.5)),auVar108,0xf8);
  auVar70 = ZEXT416((uint)(fVar82 * 3.5 + auVar70._0_4_));
  auVar70 = vroundss_avx(auVar70,auVar70,0xb);
  auVar71 = vpternlogd_avx512vl(auVar109,ZEXT416((uint)(fVar82 * 4.5)),auVar108,0xf8);
  auVar71 = ZEXT416((uint)(fVar82 * 4.5 + auVar71._0_4_));
  auVar71 = vroundss_avx(auVar71,auVar71,0xb);
  auVar72 = vpternlogd_avx512vl(auVar109,ZEXT416((uint)(fVar82 * 5.5)),auVar108,0xf8);
  auVar72 = ZEXT416((uint)(fVar82 * 5.5 + auVar72._0_4_));
  auVar72 = vroundss_avx(auVar72,auVar72,0xb);
  auVar73 = vpternlogd_avx512vl(auVar109,ZEXT416((uint)(fVar82 * 6.5)),auVar108,0xf8);
  auVar73 = ZEXT416((uint)(fVar82 * 6.5 + auVar73._0_4_));
  auVar73 = vroundss_avx(auVar73,auVar73,0xb);
  auVar74 = vpternlogd_avx512vl(auVar109,ZEXT416((uint)(fVar82 * 7.5)),auVar108,0xf8);
  auVar74 = ZEXT416((uint)(auVar74._0_4_ + fVar82 * 7.5));
  auVar74 = vroundss_avx(auVar74,auVar74,0xb);
  auVar75 = vpternlogd_avx512vl(auVar109,ZEXT416((uint)(fVar82 * 8.5)),auVar108,0xf8);
  auVar75 = ZEXT416((uint)(fVar82 * 8.5 + auVar75._0_4_));
  auVar75 = vroundss_avx(auVar75,auVar75,0xb);
  auVar76 = vpternlogd_avx512vl(auVar109,ZEXT416((uint)(fVar82 * 9.5)),auVar108,0xf8);
  auVar76 = ZEXT416((uint)(fVar82 * 9.5 + auVar76._0_4_));
  auVar76 = vroundss_avx(auVar76,auVar76,0xb);
  auVar77 = vpternlogd_avx512vl(auVar109,ZEXT416((uint)(fVar82 * 10.5)),auVar108,0xf8);
  auVar77 = ZEXT416((uint)(fVar82 * 10.5 + auVar77._0_4_));
  auVar77 = vroundss_avx(auVar77,auVar77,0xb);
  auVar78 = vpternlogd_avx512vl(auVar109,ZEXT416((uint)(fVar82 * 11.5)),auVar108,0xf8);
  auVar78 = ZEXT416((uint)(fVar82 * 11.5 + auVar78._0_4_));
  auVar78 = vroundss_avx(auVar78,auVar78,0xb);
  fVar88 = auVar69._0_4_;
  fVar82 = fVar88 + auVar68._0_4_;
  fVar7 = fVar88 + auVar67._0_4_;
  fVar8 = fVar88 - auVar67._0_4_;
  fVar81 = fVar88 - auVar68._0_4_;
  fVar87 = fVar88 - auVar70._0_4_;
  fVar93 = fVar88 - auVar71._0_4_;
  fVar9 = fVar88 - auVar72._0_4_;
  fVar88 = fVar88 - auVar73._0_4_;
  fVar105 = auVar74._0_4_;
  fVar10 = fVar105 - auVar70._0_4_;
  fVar11 = fVar105 - auVar71._0_4_;
  fVar12 = fVar105 - auVar72._0_4_;
  fVar13 = fVar105 - auVar73._0_4_;
  fVar14 = fVar105 - auVar75._0_4_;
  fVar15 = fVar105 - auVar76._0_4_;
  fVar16 = fVar105 - auVar77._0_4_;
  fVar105 = fVar105 - auVar78._0_4_;
  gauss_s1_c0[0] = expf(fVar82 * fVar82 * fVar80);
  gauss_s1_c0[1] = expf(fVar7 * fVar7 * fVar80);
  gauss_s1_c0[2] = expf(fVar8 * fVar8 * fVar80);
  gauss_s1_c0[3] = expf(fVar81 * fVar81 * fVar80);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar87 * fVar87 * fVar80);
  gauss_s1_c0[6] = expf(fVar93 * fVar93 * fVar80);
  gauss_s1_c0[7] = expf(fVar9 * fVar9 * fVar80);
  gauss_s1_c0[8] = expf(fVar88 * fVar88 * fVar80);
  gauss_s1_c1[0] = expf(fVar10 * fVar10 * fVar80);
  gauss_s1_c1[1] = expf(fVar11 * fVar11 * fVar80);
  gauss_s1_c1[2] = expf(fVar12 * fVar12 * fVar80);
  gauss_s1_c1[3] = expf(fVar13 * fVar13 * fVar80);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar14 * fVar14 * fVar80);
  gauss_s1_c1[6] = expf(fVar15 * fVar15 * fVar80);
  gauss_s1_c1[7] = expf(fVar16 * fVar16 * fVar80);
  gauss_s1_c1[8] = expf(fVar105 * fVar105 * fVar80);
  uVar26 = 0xfffffff8;
  lVar63 = 0;
  fVar82 = 0.0;
  auVar86._8_4_ = 0x7fffffff;
  auVar86._0_8_ = 0x7fffffff7fffffff;
  auVar86._12_4_ = 0x7fffffff;
  lVar62 = 0;
  lVar56 = 0;
  do {
    pfVar54 = gauss_s1_c1;
    uVar25 = (uint)uVar26;
    if (uVar25 != 7) {
      pfVar54 = gauss_s1_c0;
    }
    if (uVar25 == 0xfffffff8) {
      pfVar54 = gauss_s1_c1;
    }
    lVar62 = (long)(int)lVar62;
    iVar65 = (int)lVar56;
    lVar56 = (long)iVar65;
    lVar48 = (long)haarResponseX + lVar63;
    lVar31 = (long)haarResponseY + lVar63;
    uVar45 = 0xfffffff8;
    uVar33 = 0;
    do {
      pfVar55 = gauss_s1_c1;
      if (uVar45 != 7) {
        pfVar55 = gauss_s1_c0;
      }
      if (uVar45 == 0xfffffff8) {
        pfVar55 = gauss_s1_c1;
      }
      uVar66 = (ulong)(uVar45 >> 0x1c & 0xfffffff8);
      auVar106 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar29 = uVar33;
      lVar61 = lVar48;
      lVar64 = lVar31;
      do {
        lVar57 = 0;
        pfVar60 = (float *)((long)pfVar54 + (ulong)(uint)((int)(uVar26 >> 0x1f) << 5));
        do {
          fVar7 = pfVar55[uVar66] * *pfVar60;
          auVar67 = vinsertps_avx(ZEXT416(*(uint *)(lVar64 + lVar57 * 4)),
                                  ZEXT416(*(uint *)(lVar61 + lVar57 * 4)),0x10);
          auVar104._0_4_ = fVar7 * auVar67._0_4_;
          auVar104._4_4_ = fVar7 * auVar67._4_4_;
          auVar104._8_4_ = fVar7 * auVar67._8_4_;
          auVar104._12_4_ = fVar7 * auVar67._12_4_;
          auVar67 = vandps_avx(auVar104,auVar86);
          auVar67 = vmovlhps_avx(auVar104,auVar67);
          auVar91._0_4_ = auVar106._0_4_ + auVar67._0_4_;
          auVar91._4_4_ = auVar106._4_4_ + auVar67._4_4_;
          auVar91._8_4_ = auVar106._8_4_ + auVar67._8_4_;
          auVar91._12_4_ = auVar106._12_4_ + auVar67._12_4_;
          auVar106 = ZEXT1664(auVar91);
          pfVar60 = pfVar60 + (ulong)(~uVar25 >> 0x1f) * 2 + -1;
          lVar57 = lVar57 + 1;
        } while (lVar57 != 9);
        uVar29 = uVar29 + 0x18;
        uVar66 = uVar66 + (ulong)(-1 < (int)uVar45) * 2 + -1;
        lVar61 = lVar61 + 0x60;
        lVar64 = lVar64 + 0x60;
      } while (uVar29 < uVar45 * 0x18 + 0x198);
      fVar7 = gauss_s2_arr[lVar56];
      auVar19._4_4_ = fVar7;
      auVar19._0_4_ = fVar7;
      auVar19._8_4_ = fVar7;
      auVar19._12_4_ = fVar7;
      auVar69 = vmulps_avx512vl(auVar91,auVar19);
      lVar56 = lVar56 + 1;
      *(undefined1 (*) [16])(ipoint->descriptor + lVar62) = auVar69;
      auVar95._0_4_ = auVar69._0_4_ * auVar69._0_4_;
      auVar95._4_4_ = auVar69._4_4_ * auVar69._4_4_;
      auVar95._8_4_ = auVar69._8_4_ * auVar69._8_4_;
      auVar95._12_4_ = auVar69._12_4_ * auVar69._12_4_;
      auVar67 = vmovshdup_avx(auVar95);
      auVar68 = vfmadd231ss_fma(auVar67,auVar69,auVar69);
      auVar67 = vshufpd_avx(auVar69,auVar69,1);
      auVar68 = vfmadd213ss_fma(auVar67,auVar67,auVar68);
      auVar67 = vshufps_avx(auVar69,auVar69,0xff);
      auVar67 = vfmadd213ss_fma(auVar67,auVar67,auVar68);
      fVar82 = fVar82 + auVar67._0_4_;
      lVar62 = lVar62 + 4;
      uVar45 = uVar45 + 5;
      uVar33 = uVar33 + 0x78;
      lVar48 = lVar48 + 0x1e0;
      lVar31 = lVar31 + 0x1e0;
    } while (iVar65 + 4 != (int)lVar56);
    lVar63 = lVar63 + 0x14;
    uVar26 = (ulong)(uVar25 + 5);
  } while ((int)uVar25 < 3);
  if (fVar82 < 0.0) {
    fVar82 = sqrtf(fVar82);
  }
  else {
    auVar67 = vsqrtss_avx(ZEXT416((uint)fVar82),ZEXT416((uint)fVar82));
    fVar82 = auVar67._0_4_;
  }
  auVar106 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar82)));
  lVar63 = 0;
  do {
    auVar110 = vmulps_avx512f(auVar106,*(undefined1 (*) [64])(ipoint->descriptor + lVar63));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar63) = auVar110;
    lVar63 = lVar63 + 0x10;
  } while (lVar63 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_6_3_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=6, l_count+=6) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l4 = l + 4;
            int l5 = l + 5;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            int l_count4 = l_count + 4;
            int l_count5 = l_count + 5;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            float ipoint_y_sub_int_scale_add_l2_mul_scale = ipoint_y_sub_int_scale + l2 * scale;
            float ipoint_y_sub_int_scale_add_l3_mul_scale = ipoint_y_sub_int_scale + l3 * scale;
            float ipoint_y_sub_int_scale_add_l4_mul_scale = ipoint_y_sub_int_scale + l4 * scale;
            float ipoint_y_sub_int_scale_add_l5_mul_scale = ipoint_y_sub_int_scale + l5 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_l2_mul_scale + (ipoint_y_sub_int_scale_add_l2_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_l3_mul_scale + (ipoint_y_sub_int_scale_add_l3_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale4 = (int) (ipoint_y_sub_int_scale_add_l4_mul_scale + (ipoint_y_sub_int_scale_add_l4_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale5 = (int) (ipoint_y_sub_int_scale_add_l5_mul_scale + (ipoint_y_sub_int_scale_add_l5_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=3, k_count+=3) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count4*24+k_count0], &haarResponseY[l_count4*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count5*24+k_count0], &haarResponseY[l_count5*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count4*24+k_count1], &haarResponseY[l_count4*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count5*24+k_count1], &haarResponseY[l_count5*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count4*24+k_count2], &haarResponseY[l_count4*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count5*24+k_count2], &haarResponseY[l_count5*24+k_count2]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=6, l_count+=6) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l4 = l + 4;
            int l5 = l + 5;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            int l_count4 = l_count + 4;
            int l_count5 = l_count + 5;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_05 + l2 * scale);
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_05 + l3 * scale);
            int sample_y_sub_int_scale4 = (int) (ipoint_y_sub_int_scale_add_05 + l4 * scale);
            int sample_y_sub_int_scale5 = (int) (ipoint_y_sub_int_scale_add_05 + l5 * scale);

            for (int k=-12, k_count=0; k<12; k+=3, k_count+=3) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count4*24+k_count0], &haarResponseY[l_count4*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count5*24+k_count0], &haarResponseY[l_count5*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count4*24+k_count1], &haarResponseY[l_count4*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count5*24+k_count1], &haarResponseY[l_count5*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count4*24+k_count2], &haarResponseY[l_count4*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count5*24+k_count2], &haarResponseY[l_count5*24+k_count2]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}